

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::tracker_logger::tracker_response
          (tracker_logger *this,tracker_request *param_1,address *tracker_ip,
          list<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *tracker_ips,
          tracker_response *resp)

{
  uint uVar1;
  pointer pcVar2;
  pointer piVar3;
  pointer piVar4;
  bool bVar5;
  _Alloc_hider _Var6;
  pointer pcVar7;
  address *addr;
  address *extraout_RDX;
  address *extraout_RDX_00;
  address *extraout_RDX_01;
  address *extraout_RDX_02;
  address *addr_00;
  address *extraout_RDX_03;
  pointer ppVar8;
  ipv6_peer_entry *p_2;
  pointer piVar9;
  ipv4_peer_entry *p_1;
  pointer piVar10;
  peer_entry *p;
  pointer ppVar11;
  span<const_char> in;
  string local_90;
  string local_70;
  pointer local_50;
  size_type local_48;
  size_type sStack_40;
  
  uVar1 = (resp->interval).__r;
  print_address_abi_cxx11_(&local_70,(aux *)&resp->external_ip,tracker_ip);
  _Var6._M_p = local_70._M_dataplus._M_p;
  print_address_abi_cxx11_(&local_90,(aux *)tracker_ip,addr);
  (*(this->super_request_callback)._vptr_request_callback[7])
            (this,"TRACKER RESPONSE\ninterval: %d\nexternal ip: %s\nwe connected to: %s\npeers:",
             (ulong)uVar1,_Var6._M_p,local_90._M_dataplus._M_p);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_70);
  ppVar8 = (resp->peers).
           super__Vector_base<libtorrent::aux::peer_entry,_std::allocator<libtorrent::aux::peer_entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  addr_00 = extraout_RDX;
  local_50 = ppVar8;
  for (ppVar11 = (resp->peers).
                 super__Vector_base<libtorrent::aux::peer_entry,_std::allocator<libtorrent::aux::peer_entry>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVar11 != ppVar8; ppVar11 = ppVar11 + 1
      ) {
    pcVar2 = (ppVar11->hostname)._M_dataplus._M_p;
    pcVar7 = (pointer)(ulong)ppVar11->port;
    bVar5 = digest32<160L>::is_all_zeros(&ppVar11->pid);
    if (bVar5) {
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,"  %16s %5d %s",pcVar2,pcVar7,"");
      addr_00 = extraout_RDX_00;
    }
    else {
      in.m_len = (difference_type)_Var6._M_p;
      in.m_ptr = (char *)0x14;
      to_hex_abi_cxx11_(&local_70,(aux *)&ppVar11->pid,in);
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,"  %16s %5d %s",pcVar2,pcVar7,local_70._M_dataplus._M_p);
      ppVar8 = local_50;
      ::std::__cxx11::string::~string((string *)&local_70);
      addr_00 = extraout_RDX_01;
    }
    _Var6._M_p = pcVar7;
  }
  piVar3 = (resp->peers4).
           super__Vector_base<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (piVar10 = (resp->peers4).
                 super__Vector_base<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
                 ._M_impl.super__Vector_impl_data._M_start; piVar10 != piVar3; piVar10 = piVar10 + 1
      ) {
    local_90._M_dataplus._M_p = (pointer)((ulong)*(uint *)(piVar10->ip)._M_elems << 0x20);
    local_90._M_string_length = 0;
    local_90.field_2._M_allocated_capacity = 0;
    local_90.field_2._8_8_ = 0;
    print_address_abi_cxx11_(&local_70,(aux *)&local_90,addr_00);
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,"  %s:%d",local_70._M_dataplus._M_p,(ulong)piVar10->port);
    ::std::__cxx11::string::~string((string *)&local_70);
    addr_00 = extraout_RDX_02;
  }
  piVar4 = (resp->peers6).
           super__Vector_base<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (piVar9 = (resp->peers6).
                super__Vector_base<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
                ._M_impl.super__Vector_impl_data._M_start; piVar9 != piVar4; piVar9 = piVar9 + 1) {
    local_90._M_string_length = *(size_type *)(piVar9->ip)._M_elems;
    local_90.field_2._M_allocated_capacity = *(undefined8 *)((piVar9->ip)._M_elems + 8);
    local_90._M_dataplus._M_p = (pointer)0x1;
    local_90.field_2._8_8_ = 0;
    local_48 = local_90._M_string_length;
    sStack_40 = local_90.field_2._M_allocated_capacity;
    print_address_abi_cxx11_(&local_70,(aux *)&local_90,addr_00);
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,"  [%s]:%d",local_70._M_dataplus._M_p,(ulong)piVar9->port);
    ::std::__cxx11::string::~string((string *)&local_70);
    addr_00 = extraout_RDX_03;
  }
  return;
}

Assistant:

void tracker_logger::tracker_response(tracker_request const&
			, libtorrent::address const& tracker_ip
			, std::list<address> const& tracker_ips
			, struct tracker_response const& resp)
		{
			TORRENT_UNUSED(tracker_ips);
			debug_log("TRACKER RESPONSE\n"
				"interval: %d\n"
				"external ip: %s\n"
				"we connected to: %s\n"
				"peers:"
				, resp.interval.count()
				, print_address(resp.external_ip).c_str()
				, print_address(tracker_ip).c_str());

			for (auto const& p : resp.peers)
			{
				debug_log("  %16s %5d %s", p.hostname.c_str(), p.port
					, p.pid.is_all_zeros() ? "" : to_hex(p.pid).c_str());
			}
			for (auto const& p : resp.peers4)
			{
				debug_log("  %s:%d", print_address(address_v4(p.ip)).c_str(), p.port);
			}
			for (auto const& p : resp.peers6)
			{
				debug_log("  [%s]:%d", print_address(address_v6(p.ip)).c_str(), p.port);
			}
		}